

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxPlatformMisc.cpp
# Opt level: O2

Uint64 Diligent::LinuxMisc::SetCurrentThreadAffinity(Uint64 Mask)

{
  int iVar1;
  pthread_t __th;
  ulong uVar2;
  Uint32 j;
  ulong uVar3;
  Uint64 UVar4;
  Uint64 UVar5;
  cpu_set_t CPUSet;
  
  __th = pthread_self();
  iVar1 = pthread_getaffinity_np(__th,0x80,(cpu_set_t *)&CPUSet);
  if (iVar1 == 0) {
    UVar5 = 0;
    for (uVar2 = 0; uVar2 != 0x40; uVar2 = uVar2 + 1) {
      uVar3 = 0;
      if ((CPUSet.__bits[0] >> (uVar2 & 0x3f) & 1) != 0) {
        uVar3 = 1L << ((byte)uVar2 & 0x3f);
      }
      UVar5 = UVar5 | uVar3;
    }
  }
  else {
    UVar5 = 0;
  }
  CPUSet.__bits[0xe] = 0;
  CPUSet.__bits[0xf] = 0;
  CPUSet.__bits[0xc] = 0;
  CPUSet.__bits[0xd] = 0;
  CPUSet.__bits[10] = 0;
  CPUSet.__bits[0xb] = 0;
  CPUSet.__bits[8] = 0;
  CPUSet.__bits[9] = 0;
  CPUSet.__bits[6] = 0;
  CPUSet.__bits[7] = 0;
  CPUSet.__bits[4] = 0;
  CPUSet.__bits[5] = 0;
  CPUSet.__bits[2] = 0;
  CPUSet.__bits[3] = 0;
  CPUSet.__bits[0] = 0;
  CPUSet.__bits[1] = 0;
  uVar2 = 0;
  for (uVar3 = 0; uVar3 != 0x40; uVar3 = uVar3 + 1) {
    if ((Mask >> (uVar3 & 0x3f) & 1) != 0) {
      uVar2 = uVar2 | 1L << ((byte)uVar3 & 0x3f);
      CPUSet.__bits[0] = uVar2;
    }
  }
  iVar1 = pthread_setaffinity_np(__th,0x80,(cpu_set_t *)&CPUSet);
  UVar4 = 0;
  if (iVar1 == 0) {
    UVar4 = UVar5;
  }
  return UVar4;
}

Assistant:

Uint64 LinuxMisc::SetCurrentThreadAffinity(Uint64 Mask)
{
    const auto CurrThread = pthread_self();

    Uint64 CurrAffinity = 0;

    cpu_set_t CPUSet;
    if (pthread_getaffinity_np(CurrThread, sizeof(CPUSet), &CPUSet) == 0)
    {
        for (Uint32 j = 0; j < 64; ++j)
        {
            if (CPU_ISSET(j, &CPUSet))
                CurrAffinity |= Uint64{1} << j;
        }
    }

    CPU_ZERO(&CPUSet);
    for (Uint32 j = 0; j < 64; j++)
    {
        if (Mask & (Uint64{1} << j))
            CPU_SET(j, &CPUSet);
    }

    if (pthread_setaffinity_np(CurrThread, sizeof(CPUSet), &CPUSet) == 0)
        return CurrAffinity;
    else
        return 0;
}